

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::ClipperBase::Clear(ClipperBase *this)

{
  pointer ppTVar1;
  pointer ppTVar2;
  size_type i;
  ulong uVar3;
  
  DisposeLocalMinimaList(this);
  uVar3 = 0;
  while( true ) {
    ppTVar1 = (this->m_edges).
              super__Vector_base<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppTVar2 = (this->m_edges).
              super__Vector_base<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppTVar2 - (long)ppTVar1 >> 3) <= uVar3) break;
    if (ppTVar1[uVar3] != (TEdge *)0x0) {
      operator_delete__(ppTVar1[uVar3]);
    }
    uVar3 = uVar3 + 1;
  }
  if (ppTVar2 != ppTVar1) {
    (this->m_edges).super__Vector_base<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppTVar1;
  }
  this->m_UseFullRange = false;
  return;
}

Assistant:

void ClipperBase::Clear()
{
  DisposeLocalMinimaList();
  for (EdgeList::size_type i = 0; i < m_edges.size(); ++i) delete [] m_edges[i];
  m_edges.clear();
  m_UseFullRange = false;
}